

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O1

void __thiscall
pstore::index::
hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
::clear(hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
        *this,index_pointer node,uint shifts)

{
  index_pointer node_00;
  uint uVar1;
  long lVar2;
  internal_node *__range3;
  
  if ((~node._0_4_ & 3) == 0) {
    if (shifts < 0x42) {
      uVar1 = details::internal_node::size(node.internal_ & 0xfffffffffffffffcU);
      if (uVar1 != 0) {
        lVar2 = 0;
        do {
          node_00 = *(index_pointer *)
                     ((long)(node.internal_ & 0xfffffffffffffffcU)->children_ + lVar2);
          if (((ulong)node_00.internal_ & 2) != 0) {
            clear(this,node_00,shifts + 6);
          }
          lVar2 = lVar2 + 8;
        } while ((ulong)uVar1 << 3 != lVar2);
      }
    }
    delete_node(this,node,shifts);
    return;
  }
  assert_failed("node.is_heap () && !node.is_leaf ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x2a0);
}

Assistant:

void hamt_map<KeyType, ValueType, Hash, KeyEqual>::clear (index_pointer node,
                                                                  unsigned shifts) {
            PSTORE_ASSERT (node.is_heap () && !node.is_leaf ());
            if (details::depth_is_internal_node (shifts)) {
                auto * const internal = node.untag<internal_node *> ();
                // Recursively release the children of this internal node.
                for (auto p : *internal) {
                    if (p.is_heap ()) {
                        this->clear (p, shifts + details::hash_index_bits);
                    }
                }
            }

            this->delete_node (node, shifts);
        }